

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectiveParser.cpp
# Opt level: O0

void __thiscall Refal2::CDirectiveParser::wrongDirectiveFormat(CDirectiveParser *this)

{
  string local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [32];
  CDirectiveParser *local_10;
  CDirectiveParser *this_local;
  
  local_10 = this;
  CParsingElementState::SetWrong
            (&(this->super_CRuleParser).super_CQualifierParser.super_CParsingElementState);
  std::operator+((char *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"wrong `");
  std::operator+(local_30,(char *)local_50);
  CErrorsHelper::RaiseError
            ((CErrorsHelper *)this,ES_Error,local_30,
             &(this->super_CRuleParser).super_CQualifierParser.token);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void CDirectiveParser::wrongDirectiveFormat()
{
	SetWrong();
	CErrorsHelper::RaiseError( ES_Error, "wrong `" + directive.word
		+ "` directive format", token );
}